

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_non_uniform.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateGroupNonUniformRotateKHR
          (ValidationState_t *_,Instruction *inst)

{
  Instruction *pIVar1;
  bool bVar2;
  uint uVar3;
  uint32_t id;
  Op opcode;
  int32_t iVar4;
  DiagnosticStream *pDVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  size_type sVar6;
  DiagnosticStream local_b68;
  undefined1 local_989;
  ulong uStack_988;
  bool valid_const;
  uint64_t cluster_size;
  DiagnosticStream local_7a8;
  Instruction *local_5d0;
  Instruction *cluster_size_inst;
  undefined1 local_5c0 [4];
  uint32_t cluster_size_op_id;
  uint32_t local_3e4;
  undefined1 local_3e0 [4];
  uint32_t delta_type;
  uint32_t local_204;
  undefined1 local_200 [4];
  uint32_t value_type;
  uint32_t local_24;
  Instruction *pIStack_20;
  uint32_t result_type;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  local_24 = Instruction::type_id(inst);
  bVar2 = ValidationState_t::IsIntScalarOrVectorType((ValidationState_t *)inst_local,local_24);
  if (((!bVar2) &&
      (bVar2 = ValidationState_t::IsFloatScalarOrVectorType
                         ((ValidationState_t *)inst_local,local_24), !bVar2)) &&
     (bVar2 = ValidationState_t::IsBoolScalarOrVectorType((ValidationState_t *)inst_local,local_24),
     !bVar2)) {
    ValidationState_t::diag
              ((DiagnosticStream *)local_200,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
               pIStack_20);
    pDVar5 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)local_200,
                        (char (*) [90])
                        "Expected Result Type to be a scalar or vector of floating-point, integer or boolean type."
                       );
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_200);
    return __local._4_4_;
  }
  pIVar1 = inst_local;
  uVar3 = Instruction::GetOperandAs<unsigned_int>(pIStack_20,3);
  local_204 = ValidationState_t::GetTypeId((ValidationState_t *)pIVar1,uVar3);
  pIVar1 = inst_local;
  if (local_204 != local_24) {
    ValidationState_t::diag
              ((DiagnosticStream *)local_3e0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
               pIStack_20);
    pDVar5 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)local_3e0,
                        (char (*) [51])"Result Type must be the same as the type of Value.");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3e0);
    return __local._4_4_;
  }
  uVar3 = Instruction::GetOperandAs<unsigned_int>(pIStack_20,4);
  local_3e4 = ValidationState_t::GetTypeId((ValidationState_t *)pIVar1,uVar3);
  bVar2 = ValidationState_t::IsUnsignedIntScalarType((ValidationState_t *)inst_local,local_3e4);
  if (!bVar2) {
    ValidationState_t::diag
              ((DiagnosticStream *)local_5c0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
               pIStack_20);
    pDVar5 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)local_5c0,
                        (char (*) [71])
                        "Delta must be a scalar of integer type, whose Signedness operand is 0.");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_5c0);
    return __local._4_4_;
  }
  this = Instruction::words(pIStack_20);
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this);
  if (sVar6 < 7) {
LAB_00239112:
    __local._4_4_ = SPV_SUCCESS;
  }
  else {
    cluster_size_inst._4_4_ = Instruction::GetOperandAs<unsigned_int>(pIStack_20,5);
    local_5d0 = ValidationState_t::FindDef((ValidationState_t *)inst_local,cluster_size_inst._4_4_);
    pIVar1 = inst_local;
    if (local_5d0 != (Instruction *)0x0) {
      id = Instruction::type_id(local_5d0);
      bVar2 = ValidationState_t::IsUnsignedIntScalarType((ValidationState_t *)pIVar1,id);
      if (bVar2) {
        opcode = Instruction::opcode(local_5d0);
        iVar4 = spvOpcodeIsConstant(opcode);
        if (iVar4 == 0) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&cluster_size,(ValidationState_t *)inst_local,
                     SPV_ERROR_INVALID_DATA,pIStack_20);
          pDVar5 = DiagnosticStream::operator<<
                             ((DiagnosticStream *)&cluster_size,
                              (char (*) [51])"ClusterSize must come from a constant instruction.");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&cluster_size);
          return __local._4_4_;
        }
        local_989 = ValidationState_t::EvalConstantValUint64
                              ((ValidationState_t *)inst_local,cluster_size_inst._4_4_,
                               &stack0xfffffffffffff678);
        if (((bool)local_989) && ((uStack_988 == 0 || ((uStack_988 & uStack_988 - 1) != 0)))) {
          ValidationState_t::diag(&local_b68,(ValidationState_t *)inst_local,SPV_WARNING,pIStack_20)
          ;
          pDVar5 = DiagnosticStream::operator<<
                             (&local_b68,
                              (char (*) [73])
                              "Behavior is undefined unless ClusterSize is at least 1 and a power of 2."
                             );
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
          DiagnosticStream::~DiagnosticStream(&local_b68);
          return __local._4_4_;
        }
        goto LAB_00239112;
      }
    }
    ValidationState_t::diag
              (&local_7a8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,pIStack_20);
    pDVar5 = DiagnosticStream::operator<<
                       (&local_7a8,
                        (char (*) [77])
                        "ClusterSize must be a scalar of integer type, whose Signedness operand is 0."
                       );
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    DiagnosticStream::~DiagnosticStream(&local_7a8);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateGroupNonUniformRotateKHR(ValidationState_t& _,
                                              const Instruction* inst) {
  // Scope is already checked by ValidateExecutionScope() above.
  const uint32_t result_type = inst->type_id();
  if (!_.IsIntScalarOrVectorType(result_type) &&
      !_.IsFloatScalarOrVectorType(result_type) &&
      !_.IsBoolScalarOrVectorType(result_type)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Result Type to be a scalar or vector of "
              "floating-point, integer or boolean type.";
  }

  const uint32_t value_type = _.GetTypeId(inst->GetOperandAs<uint32_t>(3));
  if (value_type != result_type) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Result Type must be the same as the type of Value.";
  }

  const uint32_t delta_type = _.GetTypeId(inst->GetOperandAs<uint32_t>(4));
  if (!_.IsUnsignedIntScalarType(delta_type)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Delta must be a scalar of integer type, whose Signedness "
              "operand is 0.";
  }

  if (inst->words().size() > 6) {
    const uint32_t cluster_size_op_id = inst->GetOperandAs<uint32_t>(5);
    const Instruction* cluster_size_inst = _.FindDef(cluster_size_op_id);
    if (!cluster_size_inst ||
        !_.IsUnsignedIntScalarType(cluster_size_inst->type_id())) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "ClusterSize must be a scalar of integer type, whose "
                "Signedness operand is 0.";
    }

    if (!spvOpcodeIsConstant(cluster_size_inst->opcode())) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "ClusterSize must come from a constant instruction.";
    }

    uint64_t cluster_size;
    const bool valid_const =
        _.EvalConstantValUint64(cluster_size_op_id, &cluster_size);
    if (valid_const &&
        ((cluster_size == 0) || ((cluster_size & (cluster_size - 1)) != 0))) {
      return _.diag(SPV_WARNING, inst)
             << "Behavior is undefined unless ClusterSize is at least 1 and a "
                "power of 2.";
    }

    // TODO(kpet) Warn about undefined behavior when ClusterSize is greater than
    // the declared SubGroupSize
  }

  return SPV_SUCCESS;
}